

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloadsave.cpp
# Opt level: O3

void load0(char *filename)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  Am_String h;
  ifstream in_file;
  Am_Value AStack_268;
  Am_String local_258 [12];
  float local_24c;
  double local_248;
  long local_230 [4];
  byte abStack_210 [488];
  
  std::ifstream::ifstream(local_230,filename,_S_in);
  if ((abStack_210[*(long *)(local_230[0] + -0x18)] & 5) == 0) {
    Am_Load_Save_Context::Reset();
    Am_Load_Save_Context::Load((istream *)&AStack_268);
    iVar5 = Am_Value::operator_cast_to_int(&AStack_268);
    Am_Value::~Am_Value(&AStack_268);
    Am_Load_Save_Context::Load((istream *)&AStack_268);
    lVar6 = Am_Value::operator_cast_to_long(&AStack_268);
    Am_Value::~Am_Value(&AStack_268);
    Am_Load_Save_Context::Load((istream *)&AStack_268);
    bVar1 = Am_Value::operator_cast_to_bool(&AStack_268);
    Am_Value::~Am_Value(&AStack_268);
    Am_Load_Save_Context::Load((istream *)&AStack_268);
    bVar2 = Am_Value::operator_cast_to_bool(&AStack_268);
    Am_Value::~Am_Value(&AStack_268);
    Am_Load_Save_Context::Load((istream *)&AStack_268);
    local_24c = Am_Value::operator_cast_to_float(&AStack_268);
    Am_Value::~Am_Value(&AStack_268);
    Am_Load_Save_Context::Load((istream *)&AStack_268);
    local_248 = Am_Value::operator_cast_to_double(&AStack_268);
    Am_Value::~Am_Value(&AStack_268);
    Am_Load_Save_Context::Load((istream *)&AStack_268);
    cVar3 = Am_Value::operator_cast_to_char(&AStack_268);
    Am_Value::~Am_Value(&AStack_268);
    Am_Load_Save_Context::Load((istream *)&AStack_268);
    Am_String::Am_String(local_258,&AStack_268);
    Am_Value::~Am_Value(&AStack_268);
    lVar7 = 0xd;
    pcVar8 = "Test 0 failed";
    if (((((bVar1 && !bVar2) && (lVar6 == 0x44fc16 && iVar5 == 5)) &&
         (ABS(local_24c + -54.234) < 0.0001)) && (ABS(local_248 + -123.344) < 0.0001)) &&
       (cVar3 == 'a')) {
      bVar4 = Am_String::operator==(local_258,"Hello this is a test to see what\n happens");
      pcVar8 = "Test 0 failed";
      if (bVar4 != 0) {
        pcVar8 = "Test 0 okay";
      }
      lVar7 = (ulong)(bVar4 ^ 1) * 2 + 0xb;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,lVar7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    Am_String::~Am_String(local_258);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"open failed",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  std::ifstream::~ifstream(local_230);
  return;
}

Assistant:

void
load0(const char *filename)
{
  // open the file
  std::ifstream in_file(filename, std::ios::in);
  if (!in_file) {
    std::cout << "open failed" << std::endl;
    return;
  }

  // reset internal reference counters etc. (should always be done for new stream)
  Am_Default_Load_Save_Context.Reset();

  // read-back with in same order
  int a = Am_Default_Load_Save_Context.Load(in_file);
  long b = Am_Default_Load_Save_Context.Load(in_file);
  bool c = Am_Default_Load_Save_Context.Load(in_file);
  bool d = Am_Default_Load_Save_Context.Load(in_file);
  float e = Am_Default_Load_Save_Context.Load(in_file);
  double f = Am_Default_Load_Save_Context.Load(in_file);
  char g = Am_Default_Load_Save_Context.Load(in_file);
  Am_String h = Am_Default_Load_Save_Context.Load(in_file);

  // now do the check, that we read back the correct values
  if (a == 5 && b == 4520982 && c && !d && (fabs(e - 54.234) < 0.0001) &&
      (fabs(f - 123.344) < 0.0001) && g == 'a' &&
      h == "Hello this is a test to see what\n happens") {
    // everything is ok
    std::cout << "Test 0 okay" << std::endl;
  } else {
    // ups, there is a problem
    std::cout << "Test 0 failed" << std::endl;
  }
}